

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.c
# Opt level: O0

void armci_msg_gop_scope(int scope,void *x,int n,char *op,int type)

{
  int in_EDX;
  char *in_RSI;
  int in_EDI;
  void *unaff_retaddr;
  ARMCI_Group in_stack_ffffffffffffffe8;
  
  if (in_EDI == 0x151) {
    if (_number_of_procs_per_node < 2) {
      do_gop(unaff_retaddr,0x151,in_RSI,in_EDX,in_stack_ffffffffffffffe8);
    }
    else {
      do_gop(unaff_retaddr,0x151,in_RSI,in_EDX,in_stack_ffffffffffffffe8);
    }
  }
  else {
    get_default_group();
    do_gop(unaff_retaddr,in_EDI,in_RSI,in_EDX,in_stack_ffffffffffffffe8);
  }
  return;
}

Assistant:

void armci_msg_gop_scope(int scope, void *x, int n, char* op, int type)
{
    if (SCOPE_NODE == scope) {
      if (_number_of_procs_per_node > 1) {
        do_gop(x, n, op, type, ARMCI_Node_group);
      } else {
        do_gop(x, n, op, type, ARMCI_GROUP_SELF);
      }
    } else {
        do_gop(x, n, op, type, get_default_group());
    }
}